

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O3

void __thiscall
CChromeTracer::addQueueMetadata(CChromeTracer *this,uint32_t queueNumber,string *queueName)

{
  ofstream *poVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    poVar1 = &this->m_TraceFile;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"{\"ph\":\"M\",\"name\":\"thread_name\",\"pid\":",0x25);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\"tid\":",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".1,\"args\":{\"name\":\"",0x13);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(queueName->_M_dataplus)._M_p,queueName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"}},\n",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"{\"ph\":\"M\",\"name\":\"thread_sort_index\",\"pid\":",0x2b);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\"tid\":",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".1,\"args\":{\"sort_index\":\"",0x19)
    ;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"}},\n",5);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

void addQueueMetadata(
            uint32_t queueNumber,
            const std::string& queueName )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"thread_name\",\"pid\":" << m_ProcessId
            << ",\"tid\":" << queueNumber
            << ".1,\"args\":{\"name\":\"" << queueName
            << "\"}},\n";
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"thread_sort_index\",\"pid\":" << m_ProcessId
            << ",\"tid\":" << queueNumber
            << ".1,\"args\":{\"sort_index\":\"" << queueNumber
            << "\"}},\n";
    }